

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::BayesianProbitRegressor::MergePartialFromCodedStream
          (BayesianProbitRegressor *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  BayesianProbitRegressor_Gaussian *value;
  BayesianProbitRegressor_FeatureWeight *value_00;
  string *psVar5;
  char *pcVar6;
  bool local_8a;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  BayesianProbitRegressor *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if (input->buffer_ < input->buffer_end_) {
      tag_2 = (uint32)*input->buffer_;
      if ((char)*input->buffer_ < '\x01') {
        if ((input->buffer_end_ <= input->buffer_ + 1) ||
           ((*input->buffer_ & (input->buffer_[1] ^ 0xff)) < 0x80)) goto LAB_003b5e2a;
        uStack_30 = 0x3fff;
        tag_1 = (uint)input->buffer_[1] * 0x80 + (*input->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(input,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_003b5e2a:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto LAB_003b6428;
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((tag_00 & 0xff) != 8) break;
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                        (input,&this->numberoffeatures_);
      goto joined_r0x003b641c;
    case 2:
      if ((tag_00 & 0xff) == 0x12) {
        value = mutable_bias(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                          (input,value);
        goto joined_r0x003b641c;
      }
      break;
    case 3:
      if ((tag_00 & 0xff) == 0x1a) {
        value_00 = add_features(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                          (input,value_00);
        goto joined_r0x003b641c;
      }
      break;
    default:
      break;
    case 10:
      if ((tag_00 & 0xff) == 0x52) {
        psVar5 = mutable_regressioninputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        regressioninputfeaturename_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        regressioninputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar6,iVar2,PARSE,
                           "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName"
                          );
        goto joined_r0x003b641c;
      }
      break;
    case 0xb:
      if ((tag_00 & 0xff) == 0x5a) {
        psVar5 = mutable_optimisminputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        optimisminputfeaturename_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        optimisminputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar6,iVar2,PARSE,
                           "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
        goto joined_r0x003b641c;
      }
      break;
    case 0xc:
      if ((tag_00 & 0xff) == 0x62) {
        psVar5 = mutable_samplingscaleinputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        samplingscaleinputfeaturename_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        samplingscaleinputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar6,iVar2,PARSE,
                           "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName"
                          );
        goto joined_r0x003b641c;
      }
      break;
    case 0xd:
      if ((tag_00 & 0xff) == 0x6a) {
        psVar5 = mutable_samplingtruncationinputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        samplingtruncationinputfeaturename_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        samplingtruncationinputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar6,iVar2,PARSE,
                           "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName"
                          );
        goto joined_r0x003b641c;
      }
      break;
    case 0x14:
      if ((tag_00 & 0xff) == 0xa2) {
        psVar5 = mutable_meanoutputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        meanoutputfeaturename_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        meanoutputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar6,iVar2,PARSE,
                           "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
        goto joined_r0x003b641c;
      }
      break;
    case 0x15:
      if ((tag_00 & 0xff) == 0xaa) {
        psVar5 = mutable_varianceoutputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        varianceoutputfeaturename_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        varianceoutputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar6,iVar2,PARSE,
                           "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName")
        ;
        goto joined_r0x003b641c;
      }
      break;
    case 0x16:
      if ((tag_00 & 0xff) == 0xb2) {
        psVar5 = mutable_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar6,iVar2,PARSE,
                           "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"
                          );
        goto joined_r0x003b641c;
      }
      break;
    case 0x17:
      if ((tag_00 & 0xff) == 0xba) {
        psVar5 = mutable_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        sampledprobabilityoutputfeaturename_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        sampledprobabilityoutputfeaturename_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        bVar1 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (pcVar6,iVar2,PARSE,
                           "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName"
                          );
        goto joined_r0x003b641c;
      }
    }
LAB_003b6428:
    if ((tag_00 == 0) ||
       (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
       WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
joined_r0x003b641c:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool BayesianProbitRegressor::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BayesianProbitRegressor)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 numberOfFeatures = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &numberoffeatures_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_features()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string regressionInputFeatureName = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_regressioninputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->regressioninputfeaturename().data(), this->regressioninputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string optimismInputFeatureName = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_optimisminputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->optimisminputfeaturename().data(), this->optimisminputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string samplingScaleInputFeatureName = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_samplingscaleinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->samplingscaleinputfeaturename().data(), this->samplingscaleinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string samplingTruncationInputFeatureName = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_samplingtruncationinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->samplingtruncationinputfeaturename().data(), this->samplingtruncationinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string meanOutputFeatureName = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_meanoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->meanoutputfeaturename().data(), this->meanoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string varianceOutputFeatureName = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_varianceoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->varianceoutputfeaturename().data(), this->varianceoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string pessimisticProbabilityOutputFeatureName = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_pessimisticprobabilityoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->pessimisticprobabilityoutputfeaturename().data(), this->pessimisticprobabilityoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string sampledProbabilityOutputFeatureName = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_sampledprobabilityoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->sampledprobabilityoutputfeaturename().data(), this->sampledprobabilityoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BayesianProbitRegressor)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BayesianProbitRegressor)
  return false;
#undef DO_
}